

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fout.cpp
# Opt level: O2

void __thiscall
spatial_region::fout_by_yzplane(spatial_region *this,ofstream *pfout,int i,openmode mode)

{
  ostream *poVar1;
  long lVar2;
  int j;
  long lVar3;
  int k;
  long lVar4;
  
  if ((mode & ~_S_app) == (_S_out|_S_bin)) {
    write_binary_yzplane<cellb>(pfout,&this->cb,getby,i,this->ny,this->nz);
    return;
  }
  if ((mode & ~_S_app) == _S_out) {
    for (lVar3 = 0; lVar3 < this->ny; lVar3 = lVar3 + 1) {
      lVar2 = 8;
      for (lVar4 = 0; lVar4 < this->nz; lVar4 = lVar4 + 1) {
        poVar1 = std::ostream::_M_insert<double>
                           (*(double *)
                             ((long)&(this->cb).p._M_t.
                                     super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>
                                     .super__Head_base<0UL,_cellb_***,_false>._M_head_impl[i][lVar3]
                                     ->bx + lVar2));
        std::operator<<(poVar1,"\n");
        lVar2 = lVar2 + 0x18;
      }
    }
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"fout_by_yzplane: ERROR: wrong mode");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void spatial_region::fout_by_yzplane(ofstream* pfout, int i, ios_base::openmode
        mode)
{
    if (is_mode_non_binary(mode)) {
        for(int j=0;j<ny;j++) {
            for(int k=0;k<nz;k++)
                (*pfout)<<cb[i][j][k].by<<"\n";
        }
    } else if (is_mode_binary(mode)) {
        write_binary_yzplane<cellb>(pfout, cb, getby, i, ny, nz);
    } else {
        cerr << "fout_by_yzplane: ERROR: wrong mode" << endl;
    }
}